

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CascRootFile_MNDX.cpp
# Opt level: O2

int __thiscall TRootHandler_MNDX::LoadPackageNames(TRootHandler_MNDX *this)

{
  size_t sVar1;
  int iVar2;
  void *__dest;
  undefined8 *puVar3;
  bool bFindResult;
  TMndxSearch local_60;
  
  local_60.pStruct40 = (TStruct40 *)0x0;
  local_60.FileNameIndex = 0;
  local_60.szFoundPath = (char *)0x0;
  local_60.cchFoundPath = 0;
  local_60.szSearchMask = "";
  local_60.cchSearchMask = 0;
  iVar2 = CASC_ARRAY::Create<_MNDX_PACKAGE>(&this->Packages,0x40);
  if (iVar2 == 0) {
    while( true ) {
      bFindResult = false;
      TMndxMarFile::DoSearch((this->MndxInfo).MarFiles[0],&local_60,&bFindResult);
      if (bFindResult == false) break;
      __dest = malloc(local_60.cchFoundPath + 1);
      if (__dest == (void *)0x0) {
LAB_001188cf:
        iVar2 = 0xc;
        goto LAB_001188d6;
      }
      puVar3 = (undefined8 *)CASC_ARRAY::Insert(&this->Packages,(void *)0x0,1);
      sVar1 = local_60.cchFoundPath;
      if (puVar3 == (undefined8 *)0x0) goto LAB_001188cf;
      memcpy(__dest,local_60.szFoundPath,local_60.cchFoundPath);
      *(undefined1 *)((long)__dest + sVar1) = 0;
      *puVar3 = __dest;
      puVar3[1] = sVar1;
      *(DWORD *)(puVar3 + 2) = local_60.FileNameIndex;
    }
    iVar2 = 0;
  }
LAB_001188d6:
  TMndxSearch::FreeStruct40(&local_60);
  return iVar2;
}

Assistant:

TMndxSearch()
    {
        szSearchMask = NULL;
        cchSearchMask = 0;
        szFoundPath = NULL;
        cchFoundPath = 0;
        FileNameIndex = 0;
        pStruct40 = NULL;
    }